

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointPoint.cpp
# Opt level: O2

void __thiscall chrono::fea::ChLinkPointPoint::ConstraintsLoadJacobians(ChLinkPointPoint *this)

{
  ChRowVectorRef local_148;
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true> local_128;
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
  local_f8;
  ChMatrix33<double> Jxb;
  ChMatrix33<double> Jxa;
  
  ChMatrix33<double>::ChMatrix33(&Jxa,1.0);
  ChMatrix33<double>::ChMatrix33(&Jxb,-1.0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_128,&Jxa.super_Matrix<double,_3,_3,_1,_3,_3>,0);
  ChConstraintTwoGeneric::Get_Cq_a(&local_148,&this->constraint1);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_f8,&local_148,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_f8.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_128);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_128,&Jxa.super_Matrix<double,_3,_3,_1,_3,_3>,1);
  ChConstraintTwoGeneric::Get_Cq_a(&local_148,&this->constraint2);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_f8,&local_148,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_f8.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_128);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_128,&Jxa.super_Matrix<double,_3,_3,_1,_3,_3>,2);
  ChConstraintTwoGeneric::Get_Cq_a(&local_148,&this->constraint3);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_f8,&local_148,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_f8.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_128);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_128,&Jxb.super_Matrix<double,_3,_3,_1,_3,_3>,0);
  ChConstraintTwoGeneric::Get_Cq_b(&local_148,&this->constraint1);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_f8,&local_148,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_f8.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_128);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_128,&Jxb.super_Matrix<double,_3,_3,_1,_3,_3>,1);
  ChConstraintTwoGeneric::Get_Cq_b(&local_148,&this->constraint2);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_f8,&local_148,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_f8.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_128);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_128,&Jxb.super_Matrix<double,_3,_3,_1,_3,_3>,2);
  ChConstraintTwoGeneric::Get_Cq_b(&local_148,&this->constraint3);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_f8,&local_148,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_f8.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_128);
  return;
}

Assistant:

void ChLinkPointPoint::ConstraintsLoadJacobians() {
    // compute jacobians
    ChMatrix33<> Jxa(1.0);

    ChMatrix33<> Jxb(-1.0);

    constraint1.Get_Cq_a().segment(0, 3) = Jxa.row(0);
    constraint2.Get_Cq_a().segment(0, 3) = Jxa.row(1);
    constraint3.Get_Cq_a().segment(0, 3) = Jxa.row(2);

    constraint1.Get_Cq_b().segment(0, 3) = Jxb.row(0);
    constraint2.Get_Cq_b().segment(0, 3) = Jxb.row(1);
    constraint3.Get_Cq_b().segment(0, 3) = Jxb.row(2);
}